

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O1

lock_handle<int,_std::timed_mutex> * __thiscall
gmlc::libguarded::
try_lock_handle_until<int,std::timed_mutex,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (lock_handle<int,_std::timed_mutex> *__return_storage_ptr__,libguarded *this,int *obj,
          timed_mutex *gmutex,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  mutex_type *pmVar1;
  int iVar2;
  unique_lock<std::timed_mutex> *this_00;
  bool bVar3;
  lock_type glock;
  unique_lock<std::timed_mutex> local_50;
  unique_lock<std::timed_mutex> local_40;
  unique_lock<std::timed_mutex> local_30;
  long local_20;
  long local_18;
  
  local_18 = (gmutex->super___mutex_base)._M_mutex.__align;
  local_20 = local_18 / 1000000000;
  local_18 = local_18 % 1000000000;
  local_50._M_device = (mutex_type *)obj;
  iVar2 = pthread_mutex_clocklock(obj,1,&local_20);
  pmVar1 = local_50._M_device;
  bVar3 = iVar2 == 0;
  if (bVar3) {
    this_00 = &local_30;
    local_30._M_device = local_50._M_device;
    __return_storage_ptr__->data = (pointer)this;
    local_30._M_owns = bVar3;
  }
  else {
    this_00 = &local_40;
    local_40._M_device = local_50._M_device;
    __return_storage_ptr__->data = (pointer)0x0;
    local_40._M_owns = bVar3;
  }
  local_50._M_owns = false;
  local_50._M_device = (mutex_type *)0x0;
  (__return_storage_ptr__->m_handle_lock)._M_device = pmVar1;
  (__return_storage_ptr__->m_handle_lock)._M_owns = bVar3;
  this_00->_M_device = (mutex_type *)0x0;
  this_00->_M_owns = false;
  std::unique_lock<std::timed_mutex>::~unique_lock(this_00);
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_50);
  return __return_storage_ptr__;
}

Assistant:

lock_handle<T, M> try_lock_handle_until(T* obj, M& gmutex, const TimePoint& tp)
{
    typename lock_handle<T, M>::lock_type glock(gmutex, tp);
    if (glock.owns_lock()) {
        return lock_handle<T, M>(obj, std::move(glock));
    } else {
        return lock_handle<T, M>(nullptr, std::move(glock));
    }
}